

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

string * __thiscall QPDFMatrix::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFMatrix *this)

{
  undefined1 in_CL;
  double dVar1;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  QPDFMatrix *local_18;
  QPDFMatrix *this_local;
  
  local_18 = this;
  this_local = (QPDFMatrix *)__return_storage_ptr__;
  dVar1 = fix_rounding(this->a);
  QUtil::double_to_string_abi_cxx11_(&local_158,(QUtil *)0x5,dVar1,1,(bool)in_CL);
  std::operator+(&local_138,&local_158," ");
  dVar1 = fix_rounding(this->b);
  QUtil::double_to_string_abi_cxx11_(&local_188,(QUtil *)0x5,dVar1,1,(bool)in_CL);
  std::operator+(&local_118,&local_138,&local_188);
  std::operator+(&local_f8,&local_118," ");
  dVar1 = fix_rounding(this->c);
  QUtil::double_to_string_abi_cxx11_(&local_1a8,(QUtil *)0x5,dVar1,1,(bool)in_CL);
  std::operator+(&local_d8,&local_f8,&local_1a8);
  std::operator+(&local_b8,&local_d8," ");
  dVar1 = fix_rounding(this->d);
  QUtil::double_to_string_abi_cxx11_(&local_1c8,(QUtil *)0x5,dVar1,1,(bool)in_CL);
  std::operator+(&local_98,&local_b8,&local_1c8);
  std::operator+(&local_78,&local_98," ");
  dVar1 = fix_rounding(this->e);
  QUtil::double_to_string_abi_cxx11_(&local_1e8,(QUtil *)0x5,dVar1,1,(bool)in_CL);
  std::operator+(&local_58,&local_78,&local_1e8);
  std::operator+(&local_38,&local_58," ");
  dVar1 = fix_rounding(this->f);
  QUtil::double_to_string_abi_cxx11_(&local_208,(QUtil *)0x5,dVar1,1,(bool)in_CL);
  std::operator+(__return_storage_ptr__,&local_38,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFMatrix::unparse() const
{
    return (
        QUtil::double_to_string(fix_rounding(a), 5) + " " +
        QUtil::double_to_string(fix_rounding(b), 5) + " " +
        QUtil::double_to_string(fix_rounding(c), 5) + " " +
        QUtil::double_to_string(fix_rounding(d), 5) + " " +
        QUtil::double_to_string(fix_rounding(e), 5) + " " +
        QUtil::double_to_string(fix_rounding(f), 5));
}